

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O2

void __thiscall Simulator::mul(Simulator *this,PCode *code)

{
  deque<StackSymbol,_std::allocator<StackSymbol>_> *this_00;
  simulator_error *psVar1;
  _Elt_pointer pSVar2;
  allocator local_f5;
  int local_f4;
  undefined1 local_f0 [32];
  pointer local_d0;
  double local_c8;
  pointer local_c0;
  pointer pdStack_b8;
  pointer local_b0;
  StackSymbol second;
  StackSymbol first;
  
  this_00 = &this->stack_;
  pSVar2 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar2 == (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pSVar2 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 7;
  }
  StackSymbol::StackSymbol(&first,pSVar2 + -1);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(this_00);
  pSVar2 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar2 == (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pSVar2 = (this->stack_).super__Deque_base<StackSymbol,_std::allocator<StackSymbol>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 7;
  }
  StackSymbol::StackSymbol(&second,pSVar2 + -1);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(this_00);
  if (second.type_ != kReal) {
    if (second.type_ != kInt) {
      psVar1 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_f4 = this->eip_;
      std::__cxx11::string::string((string *)local_f0,anon_var_dwarf_ad34,&local_f5);
      simulator_error::simulator_error(psVar1,&local_f4,(string *)local_f0);
      __cxa_throw(psVar1,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    second.value_.real_value = (double)second.value_.int_value;
  }
  if (first.type_ != kReal) {
    if (first.type_ != kInt) {
      psVar1 = (simulator_error *)__cxa_allocate_exception(0x30);
      local_f4 = this->eip_;
      std::__cxx11::string::string((string *)local_f0,anon_var_dwarf_ad34,&local_f5);
      simulator_error::simulator_error(psVar1,&local_f4,(string *)local_f0);
      __cxa_throw(psVar1,&simulator_error::typeinfo,simulator_error::~simulator_error);
    }
    first.value_.real_value = (double)first.value_.int_value;
  }
  local_c8 = second.value_.real_value * first.value_.real_value;
  local_f0._0_4_ = kReal;
  local_f0._16_8_ = (pointer)0x0;
  local_f0._24_8_ = (pointer)0x0;
  local_d0 = (pointer)0x0;
  local_c0 = (pointer)0x0;
  pdStack_b8 = (pointer)0x0;
  local_b0 = (pointer)0x0;
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::emplace_back<StackSymbol>
            (this_00,(StackSymbol *)local_f0);
  StackSymbol::UnionValue::~UnionValue(local_f0 + 8);
  this->eip_ = this->eip_ + 1;
  StackSymbol::UnionValue::~UnionValue(&second.value_);
  StackSymbol::UnionValue::~UnionValue(&first.value_);
  return;
}

Assistant:

void Simulator::mul(const PCode &code) {
    StackSymbol first = stack_.back();
    stack_.pop_back();
    StackSymbol second = stack_.back();
    stack_.pop_back();

    double result;
    if (second.type() == StackSymbol::Type::kInt) {
        result = second.int_value();
    } else if (second.type() == StackSymbol::Type::kReal) {
        result = second.real_value();
    } else {
        throw simulator_error(eip(), "不合法的乘法操作数");
    }
    if (first.type() == StackSymbol::Type::kInt) {
        result *= first.int_value();
    } else if (first.type() == StackSymbol::Type::kReal) {
        result *= first.real_value();
    } else {
        throw simulator_error(eip(), "不合法的乘法操作数");
    }

    stack_.push_back(StackSymbol(result));
    inc_eip();
}